

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::PostProcessFieldFeatures
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  byte *pbVar1;
  char *pcVar2;
  FieldOptions *pFVar3;
  undefined8 *puVar4;
  Symbol SVar5;
  string_view name;
  string_view relative_to;
  
  if (((field->merged_features_->field_0)._impl_.field_presence_ == 3) &&
     ((field->field_0x1 & 0xc0) == 0x40)) {
    field->field_0x1 = field->field_0x1 & 0x3f | 0x80;
  }
  if (((field->type_ == '\v') &&
      ((field->containing_type_->options_->field_0)._impl_.map_entry_ == false)) &&
     ((field->merged_features_->field_0)._impl_.message_encoding_ == 2)) {
    puVar4 = (undefined8 *)
             ((ulong)(proto->field_0)._impl_.type_name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    pcVar2 = (field->all_names_).payload_;
    relative_to._M_len = (ulong)*(ushort *)(pcVar2 + 2);
    relative_to._M_str = pcVar2 + ~relative_to._M_len;
    name._M_str = (char *)*puVar4;
    name._M_len = puVar4[1];
    SVar5 = LookupSymbol(this,name,relative_to,PLACEHOLDER_MESSAGE,LOOKUP_TYPES,false);
    if (((SVar5.ptr_)->symbol_type_ != '\x01') ||
       (*(char *)(*(long *)(SVar5.ptr_ + 0x28) + 0x53) == '\0')) {
      field->type_ = '\n';
    }
  }
  pFVar3 = field->options_;
  if ((*(byte *)((long)&pFVar3->field_0 + 0x18) & 4) != 0) {
    field->field_0x3 =
         field->field_0x3 & 0xf9 | *(char *)((long)&pFVar3->field_0 + 0x70) * '\x02' & 6U;
    (pFVar3->field_0)._impl_.ctype_ = 0;
    pbVar1 = (byte *)((long)&pFVar3->field_0 + 0x18);
    *pbVar1 = *pbVar1 & 0xfb;
  }
  return;
}

Assistant:

void DescriptorBuilder::PostProcessFieldFeatures(
    FieldDescriptor& field, const FieldDescriptorProto& proto) {
  // TODO This can be replace by a runtime check in `is_required`
  // once the `label` getter is hidden.
  if (field.features().field_presence() == FeatureSet::LEGACY_REQUIRED &&
      field.label_ == FieldDescriptor::LABEL_OPTIONAL) {
    field.label_ = FieldDescriptor::LABEL_REQUIRED;
  }
  // TODO This can be replace by a runtime check of `is_delimited`
  // once the `TYPE_GROUP` value is removed.
  if (field.type_ == FieldDescriptor::TYPE_MESSAGE &&
      !field.containing_type()->options().map_entry() &&
      field.features().message_encoding() == FeatureSet::DELIMITED) {
    Symbol type =
        LookupSymbol(proto.type_name(), field.full_name(),
                     DescriptorPool::PLACEHOLDER_MESSAGE, LOOKUP_TYPES, false);
    if (type.descriptor() == nullptr ||
        !type.descriptor()->options().map_entry()) {
      field.type_ = FieldDescriptor::TYPE_GROUP;
    }
  }

  if (field.options_->has_ctype()) {
    field.legacy_proto_ctype_ = field.options_->ctype();
    const_cast<FieldOptions*>(  // NOLINT(google3-runtime-proto-const-cast)
        field.options_)
        ->clear_ctype();
  }
}